

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O2

ETrdFileName TRD_FileNameToBytes(char *inputName,byte *binName,int *nameL)

{
  byte *pbVar1;
  ETrdFileName EVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  pcVar3 = strrchr(inputName,0x2e);
  iVar6 = (int)pcVar3 - (int)inputName;
  if (7 < iVar6) {
    iVar6 = 8;
  }
  if (pcVar3 == (char *)0x0) {
    iVar6 = 8;
  }
  uVar5 = 0;
  while (*nameL = uVar5, (int)uVar5 < iVar6) {
    if (inputName[(int)uVar5] == '\0') break;
    binName[(int)uVar5] = inputName[(int)uVar5];
    uVar5 = *nameL + 1;
  }
  while ((int)uVar5 < 8) {
    *nameL = uVar5 + 1;
    binName[(int)uVar5] = ' ';
    uVar5 = *nameL;
  }
  while (((pcVar3 != (char *)0x0 && (pbVar1 = (byte *)(pcVar3 + 1), *pbVar1 != '\0')) &&
         ((int)uVar5 < 0xb))) {
    pcVar3 = pcVar3 + 1;
    binName[(int)uVar5] = *pbVar1;
    uVar5 = *nameL + 1;
    *nameL = uVar5;
  }
  while ((uVar5 | 2) != 0xb) {
    *nameL = uVar5 + 1;
    binName[(int)uVar5] = ' ';
    uVar5 = *nameL;
  }
  for (uVar4 = (ulong)uVar5; uVar4 < 0xc; uVar4 = uVar4 + 1) {
    binName[uVar4] = '\0';
  }
  if (*nameL < 10) {
    if ((0x21 < binName[8] - 0x23) ||
       (EVar2 = OK, (0x380000001U >> ((ulong)(binName[8] - 0x23) & 0x3f) & 1) == 0)) {
      EVar2 = INVALID_EXTENSION;
    }
  }
  else {
    EVar2 = THREE_LETTER_EXTENSION;
  }
  return EVar2;
}

Assistant:

ETrdFileName TRD_FileNameToBytes(const char* inputName, byte binName[12], int & nameL) {
	constexpr int baseSz = int(STrdFile::NAME_BASE_SZ);	// pre-cast to `int` (vs `nameL`)
	const char* ext = strrchr(inputName, '.');
	const int maxL = std::min(baseSz, ext ? int(ext-inputName) : baseSz);
	nameL = 0;
	while (inputName[nameL] && nameL < maxL) {
		binName[nameL] = inputName[nameL];
		++nameL;
	}
	while (nameL < baseSz) binName[nameL++] = ' ';
	while (ext && ext[1] && nameL < int(STrdFile::NAME_ALT_FULL_SZ)) {
		binName[nameL] = ext[1];
		++nameL;
		++ext;
	}
	while (STrdFile::NAME_FULL_SZ != nameL && STrdFile::NAME_ALT_FULL_SZ != nameL) {
		binName[nameL++] = ' ';		// the file name is either 8+1 or 8+3 (not 8+2)
	}
	int fillIdx = nameL;
	while (fillIdx < 12) binName[fillIdx++] = 0;
	if (int(STrdFile::NAME_FULL_SZ) < nameL) return THREE_LETTER_EXTENSION;
	switch (binName[baseSz]) {
		case 'B': case 'C': case 'D': case '#':
			return OK;
	}
	return INVALID_EXTENSION;
}